

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O2

long __thiscall gl4cts::AdvancedUsageSwitchPrograms::Run(AdvancedUsageSwitchPrograms *this)

{
  CallLogWrapper *this_00;
  ulong uVar1;
  bool bVar2;
  GLuint program;
  GLuint *ebo;
  ulong uVar3;
  int binding;
  int offset;
  long offset_00;
  long lVar4;
  GLuint i;
  int offset_01;
  long offset_02;
  undefined1 in_stack_ffffffffffffff68;
  GLint p3;
  GLint p2;
  AdvancedUsageSwitchPrograms *local_88;
  char *xfb_var;
  string vs_str;
  GLint p1;
  string fs_str;
  
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92cc,&p1);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92d2,&p2);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92d0,&p3);
  lVar4 = 0;
  if (((7 < p1) && (0 < p2)) && (7 < p3)) {
    binding = 7;
    offset_01 = 0;
    offset = 0x80;
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      GenVSSrc_abi_cxx11_(&vs_str,this,(int)lVar4,offset_01);
      GenFSSrc_abi_cxx11_(&fs_str,this,binding,offset);
      program = gl4cts::anon_unknown_0::SACSubcaseBase::CreateProgram
                          (&this->super_SACSubcaseBase,vs_str._M_dataplus._M_p,(char *)0x0,
                           (char *)0x0,fs_str._M_dataplus._M_p,(char *)0x0,
                           (bool)in_stack_ffffffffffffff68);
      this->prog_[lVar4] = program;
      xfb_var = "o_atomic_value";
      glu::CallLogWrapper::glTransformFeedbackVaryings(this_00,program,1,&xfb_var,0x8c8d);
      gl4cts::anon_unknown_0::SACSubcaseBase::LinkProgram
                (&this->super_SACSubcaseBase,this->prog_[lVar4]);
      std::__cxx11::string::~string((string *)&fs_str);
      std::__cxx11::string::~string((string *)&vs_str);
      binding = binding + -1;
      offset_01 = offset_01 + 8;
      offset = offset + 0x10;
    }
    glu::CallLogWrapper::glGenBuffers(this_00,8,this->counter_buffer_);
    for (lVar4 = 10; lVar4 != 0x12; lVar4 = lVar4 + 1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vs_str,0x100,
                 (allocator_type *)&fs_str);
      glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->counter_buffer_[lVar4 + -10]);
      glu::CallLogWrapper::glBufferData
                (this_00,0x92c0,vs_str._M_string_length - (long)vs_str._M_dataplus._M_p,
                 vs_str._M_dataplus._M_p,0x88ea);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&vs_str);
    }
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->xfb_buffer_);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,this->xfb_buffer_);
    glu::CallLogWrapper::glBufferData(this_00,0x8c8e,1000,(void *)0x0,0x88e2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,0);
    glu::CallLogWrapper::glGenTextures(this_00,1,&this->rt_);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->rt_);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x8236,8,8,0,0x8d94,0x1405,(void *)0x0);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
    glu::CallLogWrapper::glGenFramebuffers(this_00,1,&this->fbo_);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->fbo_);
    ebo = (GLuint *)(ulong)this->rt_;
    glu::CallLogWrapper::glFramebufferTexture(this_00,0x8d40,0x8ce0,this->rt_,0);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,0);
    gl4cts::anon_unknown_0::SACSubcaseBase::CreateTriangle
              (&this->super_SACSubcaseBase,&this->vao_,&this->vbo_,ebo);
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      glu::CallLogWrapper::glBindBufferBase
                (this_00,0x92c0,(GLuint)lVar4,this->counter_buffer_[lVar4]);
    }
    offset_02 = 0;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,this->xfb_buffer_);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->fbo_);
    glu::CallLogWrapper::glViewport(this_00,0,0,8,8);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->vao_);
    offset_00 = 0x80;
    lVar4 = 0x22;
    uVar1 = 0;
    local_88 = this;
    do {
      uVar3 = uVar1;
      if (uVar3 == 8) break;
      glu::CallLogWrapper::glUseProgram(this_00,this->prog_[uVar3]);
      glu::CallLogWrapper::glBeginTransformFeedback(this_00,4);
      this = local_88;
      glu::CallLogWrapper::glDrawArrays(this_00,4,0,3);
      glu::CallLogWrapper::glEndTransformFeedback(this_00);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      bVar2 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                        (&this->super_SACSubcaseBase,this->counter_buffer_[uVar3],offset_02,3);
      if (!bVar2) break;
      bVar2 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                        (&this->super_SACSubcaseBase,
                         *(GLuint *)((long)this->counter_buffer_ + lVar4 * 2 + -0x28),offset_00,0x40
                        );
      offset_00 = offset_00 + 0x10;
      offset_02 = offset_02 + 8;
      lVar4 = lVar4 + -2;
      uVar1 = uVar3 + 1;
    } while (bVar2);
    lVar4 = -(ulong)(uVar3 < 8);
  }
  return lVar4;
}

Assistant:

virtual long Run()
	{

		GLint p1, p2, p3;
		glGetIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTER_BUFFERS, &p1);
		glGetIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTERS, &p2);
		glGetIntegerv(GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS, &p3);
		if (p1 < 8 || p2 < 1 || p3 < 8)
		{
			return NO_ERROR;
		}

		// create programs
		for (int i = 0; i < 8; ++i)
		{
			std::string vs_str  = GenVSSrc(i, i * 8);
			std::string fs_str  = GenFSSrc(7 - i, 128 + i * 16);
			const char* src_vs  = vs_str.c_str();
			const char* src_fs  = fs_str.c_str();
			prog_[i]			= CreateProgram(src_vs, NULL, NULL, NULL, src_fs, false);
			const char* xfb_var = "o_atomic_value";
			glTransformFeedbackVaryings(prog_[i], 1, &xfb_var, GL_SEPARATE_ATTRIBS);
			LinkProgram(prog_[i]);
		}

		// create atomic counter buffers
		glGenBuffers(8, counter_buffer_);
		for (int i = 0; i < 8; ++i)
		{
			std::vector<GLuint> init_data(256);
			glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_[i]);
			glBufferData(GL_ATOMIC_COUNTER_BUFFER, (GLsizeiptr)(init_data.size() * sizeof(GLuint)), &init_data[0],
						 GL_DYNAMIC_COPY);
		}
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		// create transform feedback buffer
		glGenBuffers(1, &xfb_buffer_);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 1000, NULL, GL_STREAM_COPY);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);

		// create render target
		const int s = 8;
		glGenTextures(1, &rt_);
		glBindTexture(GL_TEXTURE_2D, rt_);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_R32UI, s, s, 0, GL_RED_INTEGER, GL_UNSIGNED_INT, NULL);
		glBindTexture(GL_TEXTURE_2D, 0);

		// create fbo
		glGenFramebuffers(1, &fbo_);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, rt_, 0);
		glBindFramebuffer(GL_FRAMEBUFFER, 0);

		// create geometry
		CreateTriangle(&vao_, &vbo_, NULL);

		// draw
		for (GLuint i = 0; i < 8; ++i)
		{
			glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, i, counter_buffer_[i]);
		}
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, xfb_buffer_);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glViewport(0, 0, s, s);
		glBindVertexArray(vao_);

		for (int i = 0; i < 8; ++i)
		{
			glUseProgram(prog_[i]);
			glBeginTransformFeedback(GL_TRIANGLES);
			glDrawArrays(GL_TRIANGLES, 0, 3);
			glEndTransformFeedback();
			glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

			if (!CheckFinalCounterValue(counter_buffer_[i], i * 8, 3))
				return ERROR;
			if (!CheckFinalCounterValue(counter_buffer_[7 - i], 128 + i * 16, 64))
				return ERROR;
		}
		return NO_ERROR;
	}